

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix<Rational> __thiscall Matrix<Rational>::transposed(Matrix<Rational> *this)

{
  Rational *extraout_RDX;
  Rational *pRVar1;
  Rational *extraout_RDX_00;
  uint j;
  ulong uVar2;
  uint *in_RSI;
  long lVar3;
  uint i;
  ulong uVar4;
  Matrix<Rational> MVar5;
  
  Matrix(this,in_RSI[1],*in_RSI);
  pRVar1 = extraout_RDX;
  for (uVar4 = 0; uVar4 < *in_RSI; uVar4 = uVar4 + 1) {
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < in_RSI[1]; uVar2 = uVar2 + 1) {
      Rational::operator=(this->arr + this->N * (int)uVar2 + uVar4,
                          (Rational *)
                          ((ulong)(in_RSI[1] * (int)uVar4) * 0x40 + *(long *)(in_RSI + 2) + lVar3));
      lVar3 = lVar3 + 0x40;
      pRVar1 = extraout_RDX_00;
    }
  }
  MVar5.arr = pRVar1;
  MVar5._0_8_ = this;
  return MVar5;
}

Assistant:

const Matrix<Field> Matrix<Field>::transposed() const
{
    Matrix res(N, M);
    for(unsigned i = 0; i < M; ++i)
        for(unsigned j = 0; j < N; ++j)
        {
            res[j][i] = (*this)[i][j];
        }
    return res;
}